

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O2

FilmHandle __thiscall
pbrt::FilmHandle::Create
          (FilmHandle *this,string *name,ParameterDictionary *parameters,Float exposureTime,
          FilterHandle *filter,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  RGBFilm *pRVar2;
  ulong uVar3;
  char *fmt;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_40;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_38;
  
  bVar1 = std::operator==(name,"rgb");
  if (bVar1) {
    local_38.bits =
         (filter->
         super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
         ).bits;
    pRVar2 = RGBFilm::Create(parameters,exposureTime,(FilterHandle *)&local_38,
                             parameters->colorSpace,loc,alloc);
    uVar3 = 0x1000000000000;
  }
  else {
    bVar1 = std::operator==(name,"gbuffer");
    if (!bVar1) {
      fmt = "%s: film type unknown.";
      goto LAB_003ce534;
    }
    local_40.bits =
         (filter->
         super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
         ).bits;
    pRVar2 = (RGBFilm *)
             GBufferFilm::Create(parameters,exposureTime,(FilterHandle *)&local_40,
                                 parameters->colorSpace,loc,alloc);
    uVar3 = 0x2000000000000;
  }
  (this->super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>).bits = uVar3 | (ulong)pRVar2;
  if (((ulong)pRVar2 & 0xffffffffffff) != 0) {
    ParameterDictionary::ReportUnused(parameters);
    return (FilmHandle)(TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)this;
  }
  fmt = "%s: unable to create film.";
LAB_003ce534:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

FilmHandle FilmHandle::Create(const std::string &name,
                              const ParameterDictionary &parameters, Float exposureTime,
                              FilterHandle filter, const FileLoc *loc, Allocator alloc) {
    FilmHandle film;
    if (name == "rgb")
        film = RGBFilm::Create(parameters, exposureTime, filter, parameters.ColorSpace(),
                               loc, alloc);
    else if (name == "gbuffer")
        film = GBufferFilm::Create(parameters, exposureTime, filter,
                                   parameters.ColorSpace(), loc, alloc);
    else
        ErrorExit(loc, "%s: film type unknown.", name);

    if (!film)
        ErrorExit(loc, "%s: unable to create film.", name);

    parameters.ReportUnused();
    return film;
}